

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O2

void floaxie::digit_gen_select<false>::gen<float,char>
               (diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mp,
               diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mm,char *buffer,int *len,int *K)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> dVar6;
  kappa_pair_type kVar7;
  byte bVar8;
  size_t __n;
  byte bVar9;
  uint uVar10;
  uint n;
  char cVar11;
  ulong uVar12;
  int iVar13;
  
  if (0 < Mp->m_e) {
    __assert_fail("Mp.exponent() <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x7e,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  dVar6 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator-(Mp,Mm);
  uVar5 = raised_bit<unsigned_int>(-(long)Mp->m_e);
  uVar1 = Mp->m_f;
  bVar8 = -(char)Mp->m_e;
  bVar9 = bVar8 & 0x1f;
  n = uVar1 >> bVar9;
  uVar10 = uVar1 & uVar5 - 1;
  if (n == 0 && uVar10 == 0) {
    __assert_fail("p1 || p2",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x87,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  *len = 0;
  if (uVar1 >> bVar9 == 0) {
    bVar3 = false;
  }
  else {
    kVar7 = calculate_kappa_div(n);
    __n = (ulong)kVar7 & 0xff;
    uVar12 = (ulong)kVar7 >> 0x20;
    iVar13 = -(kVar7._0_4_ & 0xff);
    while (((char)__n != '\0' && (n != 0))) {
      uVar4 = (ulong)n % uVar12;
      iVar2 = *len;
      *len = iVar2 + 1;
      buffer[iVar2] = (char)(n / uVar12) + '0';
      uVar12 = uVar12 / 10;
      iVar13 = iVar13 + 1;
      __n = __n - 1;
      n = (uint)uVar4;
    }
    if (uVar10 <= dVar6.m_f) {
      iVar13 = *K - iVar13;
      goto LAB_0021a3f8;
    }
    memset(buffer + *len,0x30,__n);
    iVar2 = *len;
    *len = iVar2 - iVar13;
    bVar3 = 0 < iVar2 - iVar13;
  }
  bVar9 = 0;
  while (dVar6.m_f < uVar10) {
    cVar11 = (char)(uVar10 * 10 >> (bVar8 & 0x1f));
    if ((bool)(cVar11 != '\0' | bVar3)) {
      iVar13 = *len;
      *len = iVar13 + 1;
      buffer[iVar13] = cVar11 + '0';
    }
    uVar10 = uVar10 * 10 & uVar5 - 1;
    bVar9 = bVar9 + 1;
    dVar6.m_f = dVar6.m_f * 10;
    dVar6.m_e = 0;
  }
  iVar13 = *K - (uint)bVar9;
LAB_0021a3f8:
  *K = iVar13;
  return;
}

Assistant:

inline static void gen(const diy_fp<FloatType>& Mp, const diy_fp<FloatType>& Mm, CharType* buffer, int* len, int* K) noexcept
		{
			assert(Mp.exponent() <= 0);

			const diy_fp<FloatType>& delta(Mp - Mm);

			const diy_fp<FloatType> one(raised_bit<typename diy_fp<FloatType>::mantissa_storage_type>(-Mp.exponent()), Mp.exponent());

			half_of_mantissa_storage_type p1 = Mp.mantissa() >> -one.exponent();
			typename diy_fp<FloatType>::mantissa_storage_type p2 = Mp.mantissa() & (one.mantissa() - 1);

			assert(p1 || p2);

			*len = 0;

			auto delta_f = delta.mantissa();

			const bool close_to_delta = p2 <= delta_f;

			if (p1)
			{
				auto&& kappa_div(calculate_kappa_div(p1));

				unsigned char& kappa(kappa_div.first);
				half_of_mantissa_storage_type& div(kappa_div.second);

				while (kappa > 0 && p1)
				{
					buffer[(*len)++] = '0' + p1 / div;

					p1 %= div;

					kappa--;
					div /= 10;
				}

				if (close_to_delta)
				{
					*K += kappa;
					return;
				}
				else
				{
					wrap::memset(buffer + (*len), CharType('0'), kappa);
					(*len) += kappa;
				}
			}

			const bool some_already_written = (*len) > 0;
			unsigned char kappa(0);

			while (p2 > delta_f)
			{
				p2 *= 10;

				const unsigned char d = p2 >> -one.exponent();

				if (some_already_written || d)
					buffer[(*len)++] = '0' + d;

				p2 &= one.mantissa() - 1;

				++kappa;
				delta_f *= 10;
			}

			*K -= kappa;
		}